

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Request::~Request(Request *this)

{
  if (this->headers_ != (headers_t)0x0) {
    curl_slist_free_all();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&this->default_data_buffer_);
  std::unique_ptr<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>::
  ~unique_ptr(&this->default_in_handler_);
  std::unique_ptr<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>::
  ~unique_ptr(&this->default_out_handler_);
  std::_Function_base::~_Function_base(&(this->completion_).super__Function_base);
  std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::~unique_ptr
            (&this->eh_);
  return;
}

Assistant:

~Request() {
            if (headers_) {
                curl_slist_free_all(headers_);
            }
        }